

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

CordRepBtree * absl::lts_20250127::cord_internal::CordRepBtree::New(int height)

{
  CordRepBtree *pCVar1;
  
  pCVar1 = (CordRepBtree *)operator_new(0x40);
  (pCVar1->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  (pCVar1->super_CordRep).length = 0;
  (pCVar1->super_CordRep).tag = '\x03';
  (pCVar1->super_CordRep).storage[0] = (uint8_t)height;
  (pCVar1->super_CordRep).storage[1] = '\0';
  (pCVar1->super_CordRep).storage[2] = '\0';
  return pCVar1;
}

Assistant:

inline CordRepBtree* CordRepBtree::New(int height) {
  CordRepBtree* tree = new CordRepBtree;
  tree->length = 0;
  tree->InitInstance(height);
  return tree;
}